

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void spsel_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t val)

{
  uint64_t val_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  update_spsel(env,(uint32_t)val);
  return;
}

Assistant:

static void spsel_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t val)
{
    update_spsel(env, val);
}